

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void __thiscall
google::ErrnoLogMessage::ErrnoLogMessage
          (ErrnoLogMessage *this,char *file,int line,LogSeverity severity,int64 ctr,
          SendMethod send_method)

{
  SendMethod in_stack_00000008;
  
  (this->super_LogMessage).allocated_ = (LogMessageData *)0x0;
  LogMessageTime::LogMessageTime(&(this->super_LogMessage).time_);
  LogMessage::Init(&this->super_LogMessage,file,line,severity,in_stack_00000008);
  *(int64 *)&(((this->super_LogMessage).data_)->stream_).super_ostream.field_0x48 = ctr;
  return;
}

Assistant:

ErrnoLogMessage::ErrnoLogMessage(const char* file, int line,
                                 LogSeverity severity, int64 ctr,
                                 void (LogMessage::*send_method)())
    : LogMessage(file, line, severity, ctr, send_method) {}